

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ProceduralAssignStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ProceduralAssignStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          ExpressionSyntax *args_4,Token *args_5)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  ProceduralAssignStatementSyntax *this_00;
  
  this_00 = (ProceduralAssignStatementSyntax *)allocate(this,0x80,8);
  TVar3 = args_3->kind;
  uVar4 = args_3->field_0x2;
  NVar5.raw = (args_3->numFlags).raw;
  uVar6 = args_3->rawLen;
  pIVar1 = args_3->info;
  TVar7 = args_5->kind;
  uVar8 = args_5->field_0x2;
  NVar9.raw = (args_5->numFlags).raw;
  uVar10 = args_5->rawLen;
  pIVar2 = args_5->info;
  syntax::StatementSyntax::StatementSyntax((StatementSyntax *)this_00,*args,*args_1,args_2);
  (this_00->keyword).kind = TVar3;
  (this_00->keyword).field_0x2 = uVar4;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (this_00->keyword).rawLen = uVar6;
  (this_00->keyword).info = pIVar1;
  (this_00->expr).ptr = args_4;
  (this_00->semi).kind = TVar7;
  (this_00->semi).field_0x2 = uVar8;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (this_00->semi).rawLen = uVar10;
  (this_00->semi).info = pIVar2;
  (args_4->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }